

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_drawing.cpp
# Opt level: O0

void ncnn::get_text_drawing_size(char *text,int fontpixelsize,int *w,int *h)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  int *piVar4;
  int *in_RCX;
  int *in_RDX;
  int in_ESI;
  char *in_RDI;
  char ch;
  int i;
  int line_w;
  int n;
  int local_2c;
  int local_28;
  int local_24;
  int *local_20;
  int *local_18;
  int local_c;
  char *local_8;
  
  *in_RDX = 0;
  *in_RCX = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  sVar3 = strlen(in_RDI);
  local_24 = (int)sVar3;
  local_28 = 0;
  for (local_2c = 0; local_2c < local_24; local_2c = local_2c + 1) {
    cVar1 = local_8[local_2c];
    if (cVar1 == '\n') {
      piVar4 = std::max<int>(local_18,&local_28);
      *local_18 = *piVar4;
      *local_20 = local_c * 2 + *local_20;
      local_28 = 0;
    }
    iVar2 = isprint((int)cVar1);
    if (iVar2 != 0) {
      local_28 = local_c + local_28;
    }
  }
  piVar4 = std::max<int>(local_18,&local_28);
  *local_18 = *piVar4;
  *local_20 = local_c * 2 + *local_20;
  return;
}

Assistant:

void get_text_drawing_size(const char* text, int fontpixelsize, int* w, int* h)
{
    *w = 0;
    *h = 0;

    const int n = strlen(text);

    int line_w = 0;
    for (int i = 0; i < n; i++)
    {
        char ch = text[i];

        if (ch == '\n')
        {
            // newline
            *w = std::max(*w, line_w);
            *h += fontpixelsize * 2;
            line_w = 0;
        }

        if (isprint(ch) != 0)
        {
            line_w += fontpixelsize;
        }
    }

    *w = std::max(*w, line_w);
    *h += fontpixelsize * 2;
}